

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mttc0_tcstatus_mips(CPUMIPSState *env,target_ulong_conflict arg1)

{
  CPUMIPSState *cpu;
  CPUMIPSState *other;
  int other_tc;
  target_ulong_conflict arg1_local;
  CPUMIPSState *env_local;
  
  other._0_4_ = env->CP0_VPEControl & 0xff;
  other._4_4_ = arg1;
  _other_tc = env;
  cpu = mips_cpu_map_tc(env,(int *)&other);
  if ((uint)other == cpu->current_tc) {
    (cpu->active_tc).CP0_TCStatus = other._4_4_;
  }
  else {
    cpu->tcs[(int)(uint)other].CP0_TCStatus = other._4_4_;
  }
  sync_c0_tcstatus(cpu,(uint)other,other._4_4_);
  return;
}

Assistant:

void helper_mttc0_tcstatus(CPUMIPSState *env, target_ulong arg1)
{
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    CPUMIPSState *other = mips_cpu_map_tc(env, &other_tc);

    if (other_tc == other->current_tc) {
        other->active_tc.CP0_TCStatus = arg1;
    } else {
        other->tcs[other_tc].CP0_TCStatus = arg1;
    }
    sync_c0_tcstatus(other, other_tc, arg1);
}